

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O0

void __thiscall Uniforms::unflagChange(Uniforms *this)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  _Self local_30;
  _Self local_28;
  iterator it_1;
  _Self local_18;
  iterator it;
  Uniforms *this_local;
  
  it._M_node = (_Base_ptr)this;
  if ((this->m_change & 1U) != 0) {
    this->m_change = false;
    local_18._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
         ::begin(&this->data);
    while( true ) {
      it_1._M_node = (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>_>
                     ::end(&this->data);
      bVar1 = std::operator!=(&local_18,(_Self *)&it_1);
      if (!bVar1) break;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>
               ::operator->(&local_18);
      bVar1 = UniformData::check(&ppVar2->second);
      this->m_change = (byte)((this->m_change & 1U) + bVar1) != '\0';
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniformData>_>
      ::operator++(&local_18);
    }
  }
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
       ::begin(&(this->super_Scene).lights);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>_>
         ::end(&(this->super_Scene).lights);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
             ::operator->(&local_28);
    (ppVar3->second->super_Node).bChange = false;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Light_*>_>
    ::operator++(&local_28);
  }
  if ((this->super_Scene).activeCamera != (Camera *)0x0) {
    (((this->super_Scene).activeCamera)->super_Node).bChange = false;
  }
  return;
}

Assistant:

void Uniforms::unflagChange() {
    if (m_change) {
        m_change = false;

        // Flag all user uniforms as NOT changed
        for (UniformDataMap::iterator it = data.begin(); it != data.end(); ++it)
            m_change += it->second.check();
    }

    for (vera::LightsMap::iterator it = lights.begin(); it != lights.end(); ++it)
        it->second->bChange = false;

    if (activeCamera)
        activeCamera->bChange = false;
}